

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

void __thiscall
deqp::gls::anon_unknown_1::AttributeArray::setupArray
          (AttributeArray *this,bool bound,int offset,int size,InputType inputType,
          OutputType outType,bool normalized,int stride,int instanceDivisor,
          GenericVec4 *defaultAttrib,bool isPositionAttr,bool bgraComponentOrder)

{
  bool bgraComponentOrder_local;
  bool isPositionAttr_local;
  bool normalized_local;
  OutputType outType_local;
  InputType inputType_local;
  int size_local;
  int offset_local;
  bool bound_local;
  AttributeArray *this_local;
  
  this->m_componentCount = size;
  this->m_bound = bound;
  this->m_inputType = inputType;
  this->m_outputType = outType;
  this->m_normalize = normalized;
  this->m_stride = stride;
  this->m_offset = offset;
  rr::GenericVec4::operator=(&this->m_defaultAttrib,defaultAttrib);
  this->m_instanceDivisor = instanceDivisor;
  this->m_isPositionAttr = isPositionAttr;
  this->m_bgraOrder = bgraComponentOrder;
  return;
}

Assistant:

void AttributeArray::setupArray (bool bound, int offset, int size, DrawTestSpec::InputType inputType, DrawTestSpec::OutputType outType, bool normalized, int stride, int instanceDivisor, const rr::GenericVec4& defaultAttrib, bool isPositionAttr, bool bgraComponentOrder)
{
	m_componentCount	= size;
	m_bound				= bound;
	m_inputType			= inputType;
	m_outputType		= outType;
	m_normalize			= normalized;
	m_stride			= stride;
	m_offset			= offset;
	m_defaultAttrib		= defaultAttrib;
	m_instanceDivisor	= instanceDivisor;
	m_isPositionAttr	= isPositionAttr;
	m_bgraOrder			= bgraComponentOrder;
}